

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# molecule.cpp
# Opt level: O2

MolecularGraph_p __thiscall indigox::Molecule::GetMolecularGraph(Molecule *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  MolecularGraph_p MVar1;
  
  std::__shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x140));
  MVar1.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  MVar1.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (MolecularGraph_p)
         MVar1.super___shared_ptr<indigox::MolecularGraph,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

MolecularGraph_p Molecule::GetMolecularGraph() { return graph_; }